

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3;
  UserDefinedNetDeclarationSyntax *pUVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x68),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UserDefinedNetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,(TimingControlSyntax *)args_2,
                      args_3,&local_50);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UserDefinedNetDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UserDefinedNetDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.netType.deepClone(alloc),
        *deepClone<TimingControlSyntax>(*node.delay, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}